

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

string * __thiscall json::String::stringify_abi_cxx11_(string *__return_storage_ptr__,String *this)

{
  ostream *poVar1;
  stringstream local_1a0 [8];
  stringstream stream;
  ostream local_190 [376];
  String *local_18;
  String *this_local;
  
  local_18 = this;
  this_local = (String *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"\"");
  poVar1 = std::operator<<(poVar1,(string *)&this->value);
  std::operator<<(poVar1,"\"");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string stringify() const {
            std::stringstream stream;
            stream << "\"" << value << "\"";
            return stream.str();
        }